

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-filepath.cc
# Opt level: O0

bool __thiscall testing::internal::FilePath::IsDirectory(FilePath *this)

{
  long lVar1;
  uint uVar2;
  long lVar3;
  long lVar4;
  long in_FS_OFFSET;
  undefined1 local_19;
  FilePath *this_local;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = std::__cxx11::string::empty();
  local_19 = false;
  if ((uVar2 & 1) == 0) {
    lVar3 = std::__cxx11::string::c_str();
    lVar4 = std::__cxx11::string::length();
    local_19 = IsPathSeparator(*(char *)(lVar3 + lVar4 + -1));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_19;
  }
  __stack_chk_fail();
}

Assistant:

bool FilePath::IsDirectory() const {
  return !pathname_.empty() &&
         IsPathSeparator(pathname_.c_str()[pathname_.length() - 1]);
}